

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O2

const_iterator __thiscall
frozen::
set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::lower_bound<std::basic_string_view<char,std::char_traits<char>>>
          (set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  
  __y = bits::
        lower_bound<5ul,std::basic_string_view<char,std::char_traits<char>>const*,std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                  ((basic_string_view<char,_std::char_traits<char>_> *)(this + 8),key,
                   (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)this);
  if ((__y != (basic_string_view<char,_std::char_traits<char>_> *)(this + 0x58)) &&
     (bVar1 = std::less<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                        ((less<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,key,
                         __y), !bVar1)) {
    return __y;
  }
  return (basic_string_view<char,_std::char_traits<char>_> *)(this + 0x58);
}

Assistant:

constexpr const_iterator lower_bound(KeyType const &key) const {
    auto const where = bits::lower_bound<N>(keys_.begin(), key, less_than_);
    if ((where != end()) && !less_than_(key, *where))
      return where;
    else
      return end();
  }